

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int64_t get_kf_group_bits(AV1_COMP *cpi,double kf_group_err,double kf_group_avg_error)

{
  double vbr_corpus_complexity_lap;
  int64_t kf_group_bits;
  TWO_PASS *twopass;
  RATE_CONTROL *rc;
  double kf_group_avg_error_local;
  double kf_group_err_local;
  AV1_COMP *cpi_local;
  
  if (cpi->ppi->lap_enabled == 0) {
    kf_group_bits =
         (int64_t)((double)(cpi->ppi->twopass).bits_left *
                  (kf_group_err / (cpi->ppi->twopass).modified_error_left));
  }
  else {
    kf_group_bits = (long)(cpi->rc).frames_to_key * (long)(cpi->rc).avg_frame_bandwidth;
    if ((cpi->oxcf).rc_cfg.vbr_corpus_complexity_lap != 0) {
      kf_group_bits =
           (int64_t)((double)kf_group_bits *
                    (kf_group_avg_error /
                    ((double)(cpi->oxcf).rc_cfg.vbr_corpus_complexity_lap / 10.0)));
    }
  }
  return kf_group_bits;
}

Assistant:

static int64_t get_kf_group_bits(AV1_COMP *cpi, double kf_group_err,
                                 double kf_group_avg_error) {
  RATE_CONTROL *const rc = &cpi->rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  int64_t kf_group_bits;
  if (cpi->ppi->lap_enabled) {
    kf_group_bits = (int64_t)rc->frames_to_key * rc->avg_frame_bandwidth;
    if (cpi->oxcf.rc_cfg.vbr_corpus_complexity_lap) {
      double vbr_corpus_complexity_lap =
          cpi->oxcf.rc_cfg.vbr_corpus_complexity_lap / 10.0;
      /* Get the average corpus complexity of the frame */
      kf_group_bits = (int64_t)(kf_group_bits * (kf_group_avg_error /
                                                 vbr_corpus_complexity_lap));
    }
  } else {
    kf_group_bits = (int64_t)(twopass->bits_left *
                              (kf_group_err / twopass->modified_error_left));
  }

  return kf_group_bits;
}